

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionSettings.cpp
# Opt level: O2

void __thiscall
FIX::SessionSettings::set(SessionSettings *this,SessionID *sessionID,Dictionary *settings)

{
  bool bVar1;
  mapped_type *this_00;
  ConfigError *this_01;
  SessionSettings *this_02;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = has(this,sessionID);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"BeginString",(allocator<char> *)&local_40);
    Dictionary::setString
              (settings,&local_60,
               &(sessionID->m_beginString).super_StringField.super_FieldBase.m_string);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"SenderCompID",(allocator<char> *)&local_40);
    Dictionary::setString
              (settings,&local_60,
               &(sessionID->m_senderCompID).super_StringField.super_FieldBase.m_string);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"TargetCompID",(allocator<char> *)&local_40);
    Dictionary::setString
              (settings,&local_60,
               &(sessionID->m_targetCompID).super_StringField.super_FieldBase.m_string);
    std::__cxx11::string::~string((string *)&local_60);
    this_02 = (SessionSettings *)settings;
    Dictionary::merge(settings,&this->m_defaults);
    validate(this_02,settings);
    this_00 = std::
              map<FIX::SessionID,_FIX::Dictionary,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
              ::operator[](&this->m_settings,sessionID);
    Dictionary::operator=(this_00,settings);
    return;
  }
  this_01 = (ConfigError *)__cxa_allocate_exception(0x50);
  std::__cxx11::string::string((string *)&local_40,(string *)&sessionID->m_frozenString);
  std::operator+(&local_60,"Duplicate Session ",&local_40);
  ConfigError::ConfigError(this_01,&local_60);
  __cxa_throw(this_01,&ConfigError::typeinfo,Exception::~Exception);
}

Assistant:

EXCEPT(ConfigError) {
  if (has(sessionID)) {
    throw ConfigError("Duplicate Session " + sessionID.toString());
  }

  settings.setString(BEGINSTRING, sessionID.getBeginString());
  settings.setString(SENDERCOMPID, sessionID.getSenderCompID());
  settings.setString(TARGETCOMPID, sessionID.getTargetCompID());

  settings.merge(m_defaults);
  validate(settings);
  m_settings[sessionID] = settings;
}